

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O2

void __thiscall nuraft::stat_elem::stat_elem(stat_elem *this,Type _type,string *_name)

{
  Histogram *this_00;
  
  this->stat_type_ = _type;
  std::__cxx11::string::string((string *)&this->stat_name_,(string *)_name);
  (this->counter_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->gauge_).super___atomic_base<long>._M_i = 0;
  if (_type == HISTOGRAM) {
    this_00 = (Histogram *)operator_new(0x30);
    Histogram::Histogram(this_00,2.0);
  }
  else {
    this_00 = (Histogram *)0x0;
  }
  this->hist_ = this_00;
  return;
}

Assistant:

stat_elem::stat_elem(Type _type, const std::string& _name)
    : stat_type_(_type)
    , stat_name_(_name)
    , counter_(0)
    , gauge_(0)
    , hist_( ( _type == HISTOGRAM )
             ? ( new Histogram() )
             : nullptr )
    {}